

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<duckdb::string_t,int,duckdb::ArgMinMaxState<duckdb::string_t,int>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::string_t,_int> *state,string_t *x,int *y,
               AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  AggregateBinaryInput *pAVar2;
  AggregateBinaryInput *in_R9;
  bool bVar3;
  string_t x_data;
  string_t new_value;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    x_data.value._8_4_ = *y;
    x_data.value._0_8_ = (x->value).pointer.ptr;
    x_data.value._12_4_ = 0;
    Execute<duckdb::string_t,int,duckdb::ArgMinMaxState<duckdb::string_t,int>>
              ((ArgMinMaxBase<duckdb::LessThan,false> *)state,
               *(ArgMinMaxState<duckdb::string_t,_int> **)&x->value,x_data,(int)binary,in_R9);
    return;
  }
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  pAVar2 = binary;
  if ((puVar1 != (unsigned_long *)0x0) &&
     (pAVar2 = (AggregateBinaryInput *)binary->ridx,
     (puVar1[(ulong)pAVar2 >> 6] >> ((ulong)pAVar2 & 0x3f) & 1) == 0)) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    pAVar2 = (AggregateBinaryInput *)binary->lidx;
    bVar3 = (puVar1[(ulong)pAVar2 >> 6] >> ((ulong)pAVar2 & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar3;
    if (bVar3) goto LAB_018a3797;
  }
  new_value.value.pointer.ptr = (char *)pAVar2;
  new_value.value._0_8_ = (x->value).pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->arg,*(string_t **)&x->value,new_value);
LAB_018a3797:
  state->value = *y;
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}